

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

ON_SHA1_Hash *
ON_SHA1_Hash::FromString
          (ON_SHA1_Hash *__return_storage_ptr__,ON_wString *string_to_parse,bool bParseLeasingSpaces
          ,bool bParseInteriorSpace,bool bParseInteriorHyphen,ON_SHA1_Hash failure_return_value)

{
  wchar_t wVar1;
  bool bVar2;
  int iVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  int local_e4;
  int local_e0;
  int j;
  int i;
  int c;
  int sdex;
  int len;
  wchar_t *skipped;
  int digits [40];
  uint digit_count;
  wchar_t *s;
  bool bParseInteriorHyphen_local;
  bool bParseInteriorSpace_local;
  bool bParseLeasingSpaces_local;
  ON_wString *string_to_parse_local;
  
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(string_to_parse);
  if (pwVar4 == (wchar_t *)0x0) {
    *(undefined8 *)__return_storage_ptr__->m_digest = failure_return_value.m_digest._0_8_;
    *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = failure_return_value.m_digest._8_8_;
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
  }
  else {
    digits[0x27] = 0;
    memset(&skipped,0,0xa0);
    _sdex = (wchar_t *)0x0;
    iVar3 = ON_wString::Length(string_to_parse);
    for (i = 0; i < iVar3 && (uint)digits[0x27] < 0x28; i = i + 1) {
      wVar1 = pwVar4[i];
      if ((wVar1 < L'0') || (L'9' < wVar1)) {
        if ((wVar1 < L'A') || (L'F' < wVar1)) {
          if ((wVar1 < L'a') || (L'f' < wVar1)) {
            if (wVar1 == L' ') {
              if ((bParseLeasingSpaces) && (digits[0x27] == 0)) goto LAB_0083a4d5;
              if (!bParseInteriorSpace) break;
            }
            else if ((wVar1 != L'-') || (!bParseInteriorHyphen)) break;
            if ((digits[0x27] == 0) || (bVar2 = _sdex == pwVar4 + -1, _sdex = pwVar4, bVar2)) break;
          }
          else {
            uVar5 = (ulong)(uint)digits[0x27];
            digits[0x27] = digits[0x27] + 1;
            digits[uVar5 - 2] = wVar1 + L'\xffffffa9';
          }
        }
        else {
          uVar5 = (ulong)(uint)digits[0x27];
          digits[0x27] = digits[0x27] + 1;
          digits[uVar5 - 2] = wVar1 + L'\xffffffc9';
        }
      }
      else {
        uVar5 = (ulong)(uint)digits[0x27];
        digits[0x27] = digits[0x27] + 1;
        digits[uVar5 - 2] = wVar1 + L'\xffffffd0';
      }
LAB_0083a4d5:
    }
    if (((digits[0x27] != 0x28) || (iVar3 < i)) ||
       ((i < iVar3 && (bVar2 = ON_wString::IsHexDigit(pwVar4[i]), bVar2)))) {
      *(undefined8 *)__return_storage_ptr__->m_digest = failure_return_value.m_digest._0_8_;
      *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = failure_return_value.m_digest._8_8_;
      *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
           failure_return_value.m_digest._16_4_;
    }
    else {
      ON_SHA1_Hash(__return_storage_ptr__);
      local_e0 = 0;
      for (local_e4 = 0; local_e4 < 0x14; local_e4 = local_e4 + 1) {
        __return_storage_ptr__->m_digest[local_e4] =
             (char)(digits[(long)local_e0 + -2] << 4) + (char)digits[(long)(local_e0 + 1) + -2];
        local_e0 = local_e0 + 2;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SHA1_Hash::FromString(
  const ON_wString string_to_parse,
  bool bParseLeasingSpaces,
  bool bParseInteriorSpace,
  bool bParseInteriorHyphen,
  ON_SHA1_Hash failure_return_value
)
{
  const wchar_t* s = static_cast<const wchar_t*>(string_to_parse);
  if (nullptr == s)
    return failure_return_value;

  unsigned digit_count = 0;
  int digits[40] = {};
  const wchar_t* skipped = nullptr;
  const int len = string_to_parse.Length();
  int sdex = 0;
  for (/* empty init */; sdex < len && digit_count < 40; ++sdex)
  {
    const int c = (int)s[sdex];
    if (c >= '0' && c <= '9')
    {
      digits[digit_count++] = (c - '0');
    }
    else if (c >= 'A' && c <= 'F')
    {
      digits[digit_count++] = (c - 'A') + 10;
    }
    else if (c >= 'a' && c <= 'f')
    {
      digits[digit_count++] = (c - 'a') + 10;
    }
    else  if ((int)(ON_wString::Space) == c)
    {
      if (bParseLeasingSpaces && 0 == digit_count)
        continue; // skip leading white space

      if (bParseInteriorSpace && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else  if ((int)(ON_wString::HyphenMinus) == c)
    {
      if (bParseInteriorHyphen && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else
      break;
  }

  if (40 != digit_count || sdex > len || (sdex < len && true == ON_wString::IsHexDigit(s[sdex])))
    return failure_return_value;

  ON_SHA1_Hash h;
  int i = 0;
  for(int j = 0; j < 20; ++j, ++i, ++i)
    h.m_digest[j] = (ON__UINT8)(16 * digits[i] + digits[i + 1]);
  return h;
}